

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opusfile_example.c
# Opt level: O2

void print_size(FILE *_fp,opus_int64 _nbytes,int _metric,char *_spacer)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  char *__format;
  long lVar6;
  ulong uVar7;
  
  lVar2 = 1000;
  if (_metric == 0) {
    lVar2 = 0x400;
  }
  lVar6 = 0;
  uVar7 = 0;
  uVar3 = 1;
  while (((int)lVar6 != 6 && (uVar5 = uVar3 * lVar2, (long)(uVar5 - uVar7) <= _nbytes))) {
    lVar6 = lVar6 + 1;
    uVar3 = uVar5;
    uVar7 = uVar5 >> 1;
  }
  lVar2 = (long)(uVar7 + _nbytes) / (long)uVar3;
  if (lVar2 < 10 && 1 < uVar3) {
    if (uVar3 < 1000000000) {
      lVar2 = uVar7 + _nbytes * 100;
    }
    else {
      lVar2 = uVar7 / 100 + _nbytes;
      uVar3 = uVar3 / 100;
    }
    lVar4 = (lVar2 / (long)uVar3) / 100;
    lVar2 = (lVar2 / (long)uVar3) % 100;
    cVar1 = " kMGTPE"[lVar6];
    __format = "%li.%02i%s%c";
  }
  else {
    if (99 < lVar2 || uVar3 < 2) {
      fprintf((FILE *)_fp,"%li%s%c",lVar2,_spacer,(ulong)(uint)(int)" kMGTPE"[lVar6]);
      return;
    }
    if (uVar3 < 1000000000) {
      lVar2 = uVar7 + _nbytes * 10;
    }
    else {
      lVar2 = uVar7 / 10 + _nbytes;
      uVar3 = uVar3 / 10;
    }
    lVar4 = (lVar2 / (long)uVar3) / 10;
    lVar2 = (lVar2 / (long)uVar3) % 10;
    cVar1 = " kMGTPE"[lVar6];
    __format = "%li.%i%s%c";
  }
  fprintf((FILE *)_fp,__format,lVar4,lVar2,_spacer,(ulong)(uint)(int)cVar1);
  return;
}

Assistant:

static void print_size(FILE *_fp,opus_int64 _nbytes,int _metric,
 const char *_spacer){
  static const char SUFFIXES[7]={' ','k','M','G','T','P','E'};
  opus_int64 val;
  opus_int64 den;
  opus_int64 round;
  int        base;
  int        shift;
  base=_metric?1000:1024;
  round=0;
  den=1;
  for(shift=0;shift<6;shift++){
    if(_nbytes<den*base-round)break;
    den*=base;
    round=den>>1;
  }
  val=(_nbytes+round)/den;
  if(den>1&&val<10){
    if(den>=1000000000)val=(_nbytes+(round/100))/(den/100);
    else val=(_nbytes*100+round)/den;
    fprintf(_fp,"%li.%02i%s%c",(long)(val/100),(int)(val%100),
     _spacer,SUFFIXES[shift]);
  }
  else if(den>1&&val<100){
    if(den>=1000000000)val=(_nbytes+(round/10))/(den/10);
    else val=(_nbytes*10+round)/den;
    fprintf(_fp,"%li.%i%s%c",(long)(val/10),(int)(val%10),
     _spacer,SUFFIXES[shift]);
  }
  else fprintf(_fp,"%li%s%c",(long)val,_spacer,SUFFIXES[shift]);
}